

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtuiohandler.cpp
# Opt level: O0

void __thiscall QTuioHandler::process2DCurAlive(QTuioHandler *this,QOscMessage *message)

{
  bool bVar1;
  int iVar2;
  QMessageLogger *this_00;
  qsizetype qVar3;
  QDebug *o;
  const_reference pQVar4;
  QMap<int,_QTuioCursor> *in_RDI;
  long in_FS_OFFSET;
  int i;
  ConstIterator it;
  int cursorId;
  QMap<int,_QTuioCursor> newActiveCursors;
  QMap<int,_QTuioCursor> oldActiveCursors;
  QList<QVariant> arguments;
  QTuioCursor cursor_1;
  QTuioCursor cursor;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QTuioCursor *in_stack_fffffffffffffed0;
  QTuioCursor *in_stack_fffffffffffffed8;
  iterator in_stack_fffffffffffffef8;
  int local_fc;
  char *in_stack_ffffffffffffff18;
  State local_d6 [2];
  int local_d4 [3];
  qsizetype in_stack_ffffffffffffff38;
  QDebug local_b0;
  QDebug local_a8;
  QDebug local_a0;
  undefined8 local_98;
  QMap<int,_QTuioCursor> local_90;
  QList<QVariant> local_88;
  QTuioCursor local_6c;
  QTuioCursor local_50;
  QTuioCursor local_34;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_88.d.ptr = (QVariant *)0xaaaaaaaaaaaaaaaa;
  local_88.d.size = -0x5555555555555556;
  QOscMessage::arguments
            ((QOscMessage *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  local_90.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
        )(totally_ordered_wrapper<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_*>
          )0xaaaaaaaaaaaaaaaa;
  QMap<int,_QTuioCursor>::QMap
            ((QMap<int,_QTuioCursor> *)in_stack_fffffffffffffed0,
             (QMap<int,_QTuioCursor> *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
            );
  local_98 = 0xaaaaaaaaaaaaaaaa;
  QMap<int,_QTuioCursor>::QMap((QMap<int,_QTuioCursor> *)0x110920);
  local_fc = 1;
  do {
    this_00 = (QMessageLogger *)(long)local_fc;
    qVar3 = QList<QVariant>::size(&local_88);
    if (qVar3 <= (long)this_00) {
      QMap<int,_QTuioCursor>::constBegin
                ((QMap<int,_QTuioCursor> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      QMap<int,_QTuioCursor>::size((QMap<int,_QTuioCursor> *)in_stack_fffffffffffffed0);
      QList<QTuioCursor>::reserve
                ((QList<QTuioCursor> *)in_stack_fffffffffffffef8._M_node,in_stack_ffffffffffffff38);
      while( true ) {
        QMap<int,_QTuioCursor>::constEnd
                  ((QMap<int,_QTuioCursor> *)
                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        bVar1 = operator!=((const_iterator *)in_stack_fffffffffffffed0,
                           (const_iterator *)
                           CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        if (!bVar1) break;
        in_stack_fffffffffffffed0 = (QTuioCursor *)(in_RDI + 6);
        QMap<int,_QTuioCursor>::const_iterator::value((const_iterator *)0x110ca3);
        QList<QTuioCursor>::append
                  ((QList<QTuioCursor> *)in_stack_fffffffffffffed0,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        QMap<int,_QTuioCursor>::const_iterator::operator++
                  ((const_iterator *)in_stack_fffffffffffffed0);
      }
      QMap<int,_QTuioCursor>::operator=
                ((QMap<int,_QTuioCursor> *)in_stack_fffffffffffffed0,
                 (QMap<int,_QTuioCursor> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
LAB_00110cda:
      QMap<int,_QTuioCursor>::~QMap((QMap<int,_QTuioCursor> *)0x110ce7);
      QMap<int,_QTuioCursor>::~QMap((QMap<int,_QTuioCursor> *)0x110cf4);
      QList<QVariant>::~QList((QList<QVariant> *)0x110d01);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    QList<QVariant>::at((QList<QVariant> *)in_stack_fffffffffffffed0,
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    iVar2 = QVariant::userType((QVariant *)0x11096a);
    if (iVar2 != 2) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      lcTuioHandler();
      anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_fffffffffffffed0,
                 (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_71907::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1109c9);
        QMessageLogger::QMessageLogger
                  (this_00,(char *)in_stack_fffffffffffffed8,
                   (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (char *)0x1109df);
        QMessageLogger::warning();
        QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff18);
        o = QDebug::operator<<((QDebug *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        QDebug::QDebug(&local_a8,o);
        operator<<((QDebug *)in_RDI,(QList<QVariant> *)this_00);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffed0,
                           (char)((uint)in_stack_fffffffffffffecc >> 0x18));
        QDebug::~QDebug(&local_a0);
        QDebug::~QDebug(&local_a8);
        QDebug::~QDebug(&local_b0);
        local_10 = local_10 & 0xffffffffffffff00;
      }
      goto LAB_00110cda;
    }
    pQVar4 = QList<QVariant>::at((QList<QVariant> *)in_stack_fffffffffffffed0,
                                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_d4[0] = QVariant::toInt((bool *)pQVar4);
    bVar1 = QMap<int,_QTuioCursor>::contains
                      ((QMap<int,_QTuioCursor> *)this_00,&in_stack_fffffffffffffed8->m_id);
    if (bVar1) {
      local_50.m_id = -0x55555556;
      local_50.m_x = -NAN;
      local_50.m_y = -NAN;
      local_50.m_vx = -NAN;
      local_50.m_vy = -NAN;
      local_50.m_acceleration = -NAN;
      local_50.m_state = 0xaa;
      local_50._25_3_ = 0xaaaaaa;
      QTuioCursor::QTuioCursor(&local_6c,-1);
      QMap<int,_QTuioCursor>::value(in_RDI,(int *)this_00,in_stack_fffffffffffffed8);
      local_d6[0] = Stationary;
      QTuioCursor::setState(&local_50,local_d6);
      QMap<int,_QTuioCursor>::insert
                ((QMap<int,_QTuioCursor> *)this_00,&in_stack_fffffffffffffed8->m_id,
                 in_stack_fffffffffffffed0);
      QMap<int,_QTuioCursor>::remove(&local_90,(char *)local_d4);
    }
    else {
      local_34.m_id = -0x55555556;
      local_34.m_x = -NAN;
      local_34.m_y = -NAN;
      local_34.m_vx = -NAN;
      local_34.m_vy = -NAN;
      local_34.m_acceleration = -NAN;
      local_34.m_state = 0xaa;
      local_34._25_3_ = 0xaaaaaa;
      QTuioCursor::QTuioCursor(&local_34,local_d4[0]);
      local_d6[1] = 1;
      QTuioCursor::setState(&local_34,local_d6 + 1);
      in_stack_fffffffffffffef8._M_node =
           (_Base_ptr)
           QMap<int,_QTuioCursor>::insert
                     ((QMap<int,_QTuioCursor> *)this_00,&in_stack_fffffffffffffed8->m_id,
                      in_stack_fffffffffffffed0);
    }
    local_fc = local_fc + 1;
  } while( true );
}

Assistant:

void QTuioHandler::process2DCurAlive(const QOscMessage &message)
{
    QList<QVariant> arguments = message.arguments();

    // delta the notified cursors that are active, against the ones we already
    // know of.
    //
    // TBD: right now we're assuming one 2Dcur alive message corresponds to a
    // new data source from the input. is this correct, or do we need to store
    // changes and only process the deltas on fseq?
    QMap<int, QTuioCursor> oldActiveCursors = m_activeCursors;
    QMap<int, QTuioCursor> newActiveCursors;

    for (int i = 1; i < arguments.size(); ++i) {
        if (QMetaType::Type(arguments.at(i).userType()) != QMetaType::Int) {
            qCWarning(lcTuioHandler) << "Ignoring malformed TUIO alive message (bad argument on position" << i << arguments << ')';
            return;
        }

        int cursorId = arguments.at(i).toInt();
        if (!oldActiveCursors.contains(cursorId)) {
            // newly active
            QTuioCursor cursor(cursorId);
            cursor.setState(QEventPoint::State::Pressed);
            newActiveCursors.insert(cursorId, cursor);
        } else {
            // we already know about it, remove it so it isn't marked as released
            QTuioCursor cursor = oldActiveCursors.value(cursorId);
            cursor.setState(QEventPoint::State::Stationary); // position change in SET will update if needed
            newActiveCursors.insert(cursorId, cursor);
            oldActiveCursors.remove(cursorId);
        }
    }

    // anything left is dead now
    QMap<int, QTuioCursor>::ConstIterator it = oldActiveCursors.constBegin();

    // deadCursors should be cleared from the last FSEQ now
    m_deadCursors.reserve(oldActiveCursors.size());

    // TODO: there could be an issue of resource exhaustion here if FSEQ isn't
    // sent in a timely fashion. we should probably track message counts and
    // force-flush if we get too many built up.
    while (it != oldActiveCursors.constEnd()) {
        m_deadCursors.append(it.value());
        ++it;
    }

    m_activeCursors = newActiveCursors;
}